

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_close_with_pending_event(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = (uv_loop_t *)uv_default_loop();
  create_dir("watch_dir");
  create_file("watch_dir/file");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir",0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      touch_file("watch_dir/file");
      uv_close(&fs_event,close_cb);
      uv_run(loop,0);
      eval_a = 1;
      eval_b = (int64_t)close_cb_called;
      if (eval_b == 1) {
        remove("watch_dir/file");
        remove("watch_dir/");
        close_loop(loop);
        eval_a = 0;
        iVar1 = uv_loop_close(loop);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar4 = "uv_loop_close(loop)";
        pcVar3 = "0";
        uVar2 = 0x38c;
      }
      else {
        pcVar4 = "close_cb_called";
        pcVar3 = "1";
        uVar2 = 0x386;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x37d;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x37b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_event_close_with_pending_event) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");
  create_file("watch_dir/file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_fail, "watch_dir", 0);
  ASSERT_OK(r);

  /* Generate an fs event. */
  touch_file("watch_dir/file");

  uv_close((uv_handle_t*)&fs_event, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  /* Clean up */
  remove("watch_dir/file");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}